

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGElementMatch
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define,xmlNodePtr elem)

{
  xmlNs *pxVar1;
  int iVar2;
  int iVar3;
  xmlChar *arg2;
  xmlChar *pxVar4;
  uint uVar5;
  xmlRelaxNGValidErr err;
  xmlRelaxNGDefinePtr pxVar6;
  
  if ((define->name != (xmlChar *)0x0) && (iVar2 = xmlStrEqual(elem->name,define->name), iVar2 == 0)
     ) {
    pxVar4 = define->name;
    arg2 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNAME;
    goto LAB_0018ac6f;
  }
  pxVar4 = define->ns;
  if (pxVar4 == (xmlChar *)0x0) {
    if ((elem->ns == (xmlNs *)0x0) || (pxVar4 = define->name, pxVar4 == (xmlChar *)0x0))
    goto LAB_0018ac29;
LAB_0018ac1c:
    err = XML_RELAXNG_ERR_ELEMEXTRANS;
  }
  else {
    pxVar1 = elem->ns;
    if (*pxVar4 == '\0') {
      if (pxVar1 == (xmlNs *)0x0) goto LAB_0018ac29;
      pxVar4 = define->name;
      if (pxVar4 == (xmlChar *)0x0) {
        pxVar4 = elem->name;
      }
      goto LAB_0018ac1c;
    }
    if (pxVar1 != (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(pxVar1->href,pxVar4);
      if (iVar2 == 0) {
        pxVar4 = elem->name;
        arg2 = define->ns;
        err = XML_RELAXNG_ERR_ELEMWRONGNS;
        goto LAB_0018ac6f;
      }
LAB_0018ac29:
      pxVar6 = define->nameClass;
      if (pxVar6 == (xmlRelaxNGDefinePtr)0x0) {
        return 1;
      }
      iVar2 = -1;
      if (pxVar6->type == XML_RELAXNG_CHOICE) {
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = ctxt->flags;
          ctxt->flags = uVar5 | 1;
        }
        for (pxVar6 = pxVar6->nameClass; pxVar6 != (xmlRelaxNGDefinePtr_conflict)0x0;
            pxVar6 = pxVar6->next) {
          iVar3 = xmlRelaxNGElementMatch(ctxt,pxVar6,elem);
          if (iVar3 == 1) goto LAB_0018ace0;
          if (iVar3 < 0) goto LAB_0018ad0d;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          return 0;
        }
        iVar2 = 0;
        if (0 < ctxt->errNr) {
          xmlRelaxNGPopErrors(ctxt,0);
          iVar2 = 0;
        }
      }
      else {
        if (pxVar6->type != XML_RELAXNG_EXCEPT) {
          return -1;
        }
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = ctxt->flags;
          ctxt->flags = uVar5 | 1;
        }
        pxVar6 = pxVar6->content;
LAB_0018ac94:
        if (pxVar6 == (xmlRelaxNGDefinePtr_conflict)0x0) {
LAB_0018ace0:
          if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
            return 1;
          }
          ctxt->flags = uVar5;
          return 1;
        }
        iVar3 = xmlRelaxNGElementMatch(ctxt,pxVar6,elem);
        if (iVar3 != 1) {
          if (iVar3 < 0) goto LAB_0018ad0d;
          pxVar6 = pxVar6->next;
          goto LAB_0018ac94;
        }
        iVar2 = 0;
LAB_0018ad0d:
        if (ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
          return iVar2;
        }
      }
      ctxt->flags = uVar5;
      return iVar2;
    }
    pxVar4 = elem->name;
    err = XML_RELAXNG_ERR_ELEMNONS;
  }
  arg2 = (xmlChar *)0x0;
LAB_0018ac6f:
  xmlRelaxNGAddValidError(ctxt,err,pxVar4,arg2,0);
  return 0;
}

Assistant:

static int
xmlRelaxNGElementMatch(xmlRelaxNGValidCtxtPtr ctxt,
                       xmlRelaxNGDefinePtr define, xmlNodePtr elem)
{
    int ret = 0, oldflags = 0;

    if (define->name != NULL) {
        if (!xmlStrEqual(elem->name, define->name)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMNAME, define->name, elem->name);
            return (0);
        }
    }
    if ((define->ns != NULL) && (define->ns[0] != 0)) {
        if (elem->ns == NULL) {
            VALID_ERR2(XML_RELAXNG_ERR_ELEMNONS, elem->name);
            return (0);
        } else if (!xmlStrEqual(elem->ns->href, define->ns)) {
            VALID_ERR3(XML_RELAXNG_ERR_ELEMWRONGNS,
                       elem->name, define->ns);
            return (0);
        }
    } else if ((elem->ns != NULL) && (define->ns != NULL) &&
               (define->name == NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, elem->name);
        return (0);
    } else if ((elem->ns != NULL) && (define->name != NULL)) {
        VALID_ERR2(XML_RELAXNG_ERR_ELEMEXTRANS, define->name);
        return (0);
    }

    if (define->nameClass == NULL)
        return (1);

    define = define->nameClass;
    if (define->type == XML_RELAXNG_EXCEPT) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->content;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (0);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        ret = 1;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else if (define->type == XML_RELAXNG_CHOICE) {
        xmlRelaxNGDefinePtr list;

        if (ctxt != NULL) {
            oldflags = ctxt->flags;
            ctxt->flags |= FLAGS_IGNORABLE;
        }

        list = define->nameClass;
        while (list != NULL) {
            ret = xmlRelaxNGElementMatch(ctxt, list, elem);
            if (ret == 1) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (1);
            }
            if (ret < 0) {
                if (ctxt != NULL)
                    ctxt->flags = oldflags;
                return (ret);
            }
            list = list->next;
        }
        if (ctxt != NULL) {
            if (ret != 0) {
                if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                    xmlRelaxNGDumpValidError(ctxt);
            } else {
                if (ctxt->errNr > 0)
                    xmlRelaxNGPopErrors(ctxt, 0);
            }
        }
        ret = 0;
        if (ctxt != NULL) {
            ctxt->flags = oldflags;
        }
    } else {
        /* TODO */
        ret = -1;
    }
    return (ret);
}